

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O3

void __thiscall icu_63::TransliteratorSpec::setupNext(TransliteratorSpec *this)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  uint uVar3;
  int32_t length;
  int iVar4;
  uint uVar5;
  
  this->isNextLocale = '\0';
  if (this->isSpecLocale == '\0') {
    uVar2 = (this->nextSpec).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar2 & 1) != 0) {
      icu_63::UnicodeString::unBogus(&this->nextSpec);
      return;
    }
    if ((short)uVar2 < 0) {
      iVar4 = (this->nextSpec).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)(short)uVar2 >> 5;
    }
    if (iVar4 != 0) {
      (this->nextSpec).fUnion.fStackFields.fLengthAndFlags = uVar2 & 0x1e;
    }
  }
  else {
    this_00 = &this->nextSpec;
    icu_63::UnicodeString::operator=(this_00,&this->spec);
    sVar1 = (this->nextSpec).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (this->nextSpec).fUnion.fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    uVar3 = icu_63::UnicodeString::doLastIndexOf(this_00,L'_',0,length);
    if ((int)uVar3 < 1) {
      icu_63::UnicodeString::operator=(this_00,&this->scriptName);
      return;
    }
    uVar2 = (this->nextSpec).fUnion.fStackFields.fLengthAndFlags;
    if ((short)uVar2 < 0) {
      uVar5 = (this->nextSpec).fUnion.fFields.fLength;
    }
    else {
      uVar5 = (int)(short)uVar2 >> 5;
    }
    if (uVar3 < uVar5) {
      if (uVar3 < 0x400) {
        (this->nextSpec).fUnion.fStackFields.fLengthAndFlags = (ushort)(uVar3 << 5) | uVar2 & 0x1f;
      }
      else {
        (this->nextSpec).fUnion.fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
        (this->nextSpec).fUnion.fFields.fLength = uVar3;
      }
    }
    this->isNextLocale = '\x01';
  }
  return;
}

Assistant:

void TransliteratorSpec::setupNext() {
    isNextLocale = FALSE;
    if (isSpecLocale) {
        nextSpec = spec;
        int32_t i = nextSpec.lastIndexOf(LOCALE_SEP);
        // If i == 0 then we have _FOO, so we fall through
        // to the scriptName.
        if (i > 0) {
            nextSpec.truncate(i);
            isNextLocale = TRUE;
        } else {
            nextSpec = scriptName; // scriptName may be empty
        }
    } else {
        // spec is a script, so we are at the end
        nextSpec.truncate(0);
    }
}